

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void roaring_bitmap_statistics(roaring_bitmap_t *r,roaring_statistics_t *stat)

{
  byte bVar1;
  int32_t iVar2;
  uint64_t uVar3;
  int *in_RSI;
  int *in_RDI;
  uint32_t sbytes;
  uint32_t card;
  uint8_t truetype;
  int i;
  min_max_sum_t mms;
  roaring_array_t *ra;
  container_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  int iVar6;
  
  memset(in_RSI,0,0x40);
  *in_RSI = *in_RDI;
  uVar3 = roaring_bitmap_get_cardinality
                    ((roaring_bitmap_t *)
                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  *(uint64_t *)(in_RSI + 0xe) = uVar3;
  iVar5 = -1;
  iVar6 = 0;
  roaring_iterate((roaring_bitmap_t *)0xffffffff,
                  (roaring_iterator)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                  (void *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  in_RSI[0xb] = iVar5;
  in_RSI[10] = iVar6;
  in_RSI[0xc] = 0;
  in_RSI[0xd] = 0;
  for (iVar5 = 0; iVar5 < *in_RDI; iVar5 = iVar5 + 1) {
    bVar1 = get_container_type(*(container_t **)(*(long *)(in_RDI + 2) + (long)iVar5 * 8),
                               *(uint8_t *)(*(long *)(in_RDI + 6) + (long)iVar5));
    uVar4 = (uint)bVar1 << 0x18;
    iVar6 = container_get_cardinality(in_stack_ffffffffffffffb8,'\0');
    iVar2 = container_size_in_bytes(in_stack_ffffffffffffffb8,'\0');
    if (uVar4 >> 0x18 == 1) {
      in_RSI[3] = in_RSI[3] + 1;
      in_RSI[6] = iVar6 + in_RSI[6];
      in_RSI[9] = iVar2 + in_RSI[9];
    }
    else if (uVar4 >> 0x18 == 2) {
      in_RSI[1] = in_RSI[1] + 1;
      in_RSI[4] = iVar6 + in_RSI[4];
      in_RSI[7] = iVar2 + in_RSI[7];
    }
    else {
      in_RSI[2] = in_RSI[2] + 1;
      in_RSI[5] = iVar6 + in_RSI[5];
      in_RSI[8] = iVar2 + in_RSI[8];
    }
  }
  return;
}

Assistant:

void roaring_bitmap_statistics(const roaring_bitmap_t *r,
                               roaring_statistics_t *stat) {
    const roaring_array_t *ra = &r->high_low_container;

    memset(stat, 0, sizeof(*stat));
    stat->n_containers = ra->size;
    stat->cardinality = roaring_bitmap_get_cardinality(r);
    min_max_sum_t mms;
    mms.min = UINT32_C(0xFFFFFFFF);
    mms.max = UINT32_C(0);
    mms.sum = 0;
    roaring_iterate(r, &min_max_sum_fnc, &mms);
    stat->min_value = mms.min;
    stat->max_value = mms.max;
    stat->sum_value = mms.sum;

    for (int i = 0; i < ra->size; ++i) {
        uint8_t truetype =
            get_container_type(ra->containers[i], ra->typecodes[i]);
        uint32_t card =
            container_get_cardinality(ra->containers[i], ra->typecodes[i]);
        uint32_t sbytes =
            container_size_in_bytes(ra->containers[i], ra->typecodes[i]);
        switch (truetype) {
            case BITSET_CONTAINER_TYPE:
                stat->n_bitset_containers++;
                stat->n_values_bitset_containers += card;
                stat->n_bytes_bitset_containers += sbytes;
                break;
            case ARRAY_CONTAINER_TYPE:
                stat->n_array_containers++;
                stat->n_values_array_containers += card;
                stat->n_bytes_array_containers += sbytes;
                break;
            case RUN_CONTAINER_TYPE:
                stat->n_run_containers++;
                stat->n_values_run_containers += card;
                stat->n_bytes_run_containers += sbytes;
                break;
            default:
                assert(false);
                roaring_unreachable;
        }
    }
}